

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O3

void Abc_EnumerateCubeStatesZdd(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_ZddMan *p;
  long lVar5;
  int level;
  undefined4 *puVar6;
  int ZddAllPrev;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  timespec ts_2;
  int pPerm [24];
  int pComb [9];
  long local_d8;
  timespec local_c8;
  timespec local_b8 [6];
  uint local_58 [10];
  
  iVar2 = clock_gettime(3,local_b8);
  lVar5 = -1;
  local_d8 = -1;
  if (-1 < iVar2) {
    local_d8 = local_b8[0].tv_nsec / 1000 + local_b8[0].tv_sec * 1000000;
  }
  puts("Enumerating states of 2x2x2 cube.");
  p = Abc_ZddManAlloc(0x114,0x8000000);
  Abc_ZddManCreatePerms(p,0x18);
  iVar3 = 1;
  printf("Iter %2d -> %8d  Nodes = %7d  Used = %10d  ",0,1,0,2);
  iVar10 = 3;
  iVar2 = clock_gettime(3,local_b8);
  if (-1 < iVar2) {
    lVar5 = local_b8[0].tv_nsec / 1000 + local_b8[0].tv_sec * 1000000;
  }
  lVar8 = 0;
  Abc_Print(iVar10,"%s =","Time");
  Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar5 - local_d8) / 1000000.0);
  puVar6 = &DAT_008c41d4;
  do {
    lVar5 = 0;
    iVar2 = 0;
    iVar10 = 1;
    uVar11 = 2;
    uVar12 = 3;
    do {
      *(int *)((long)&local_b8[0].tv_sec + lVar5 * 4) = iVar2;
      *(int *)((long)&local_b8[0].tv_sec + lVar5 * 4 + 4) = iVar10;
      local_58[lVar5 + -0x16] = uVar11;
      local_58[lVar5 + -0x15] = uVar12;
      lVar5 = lVar5 + 4;
      iVar2 = iVar2 + 4;
      iVar10 = iVar10 + 4;
      uVar11 = uVar11 + 4;
      uVar12 = uVar12 + 4;
    } while (lVar5 != 0x18);
    lVar5 = 0;
    do {
      uVar1 = *(undefined4 *)((long)local_b8 + (long)(int)puVar6[lVar5 * 2 + -1] * 4 + -4);
      iVar2 = puVar6[lVar5 * 2];
      *(undefined4 *)((long)local_b8 + (long)(int)puVar6[lVar5 * 2 + -1] * 4 + -4) =
           *(undefined4 *)((long)local_b8 + (long)iVar2 * 4 + -4);
      *(undefined4 *)((long)local_b8 + (long)iVar2 * 4 + -4) = uVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 9);
    iVar2 = Abc_ZddPerm2Comb((int *)local_b8,0x18,(int *)local_58);
    if (iVar2 != 9) {
      __assert_fail("nSize == 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilPerm.c"
                    ,0x36b,"void Abc_EnumerateCubeStatesZdd()");
    }
    lVar5 = 0;
    do {
      uVar11 = local_58[lVar5] & 0xffff;
      iVar2 = (int)local_58[lVar5] >> 0x10;
      if ((int)uVar11 <= iVar2) {
        __assert_fail("i < j",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilPerm.c"
                      ,0x65,"int Abc_ZddVarIJ(Abc_ZddMan *, int, int)");
      }
      local_58[lVar5] = p->pT2V[(int)(iVar2 * p->nPermSize + uVar11)];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 9);
    iVar2 = Abc_ZddBuildSet(p,(int *)local_58,9);
    iVar3 = Abc_ZddUnion(p,iVar3,iVar2);
    iVar10 = Abc_ZddPermProduct(p,iVar2,iVar2);
    iVar3 = Abc_ZddUnion(p,iVar3,iVar10);
    iVar2 = Abc_ZddPermProduct(p,iVar10,iVar2);
    iVar3 = Abc_ZddUnion(p,iVar3,iVar2);
    lVar8 = lVar8 + 1;
    puVar6 = puVar6 + 0x12;
  } while (lVar8 != 3);
  uVar11 = Abc_ZddCountPaths(p,iVar3);
  uVar12 = Abc_ZddCount_rec(p,iVar3);
  Abc_ZddUnmark_rec(p,iVar3);
  printf("Iter %2d -> %8d  Nodes = %7d  Used = %10d  ",1,(ulong)uVar11,(ulong)uVar12,
         (ulong)(uint)p->nObjs);
  iVar10 = 3;
  iVar2 = clock_gettime(3,&local_c8);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_c8.tv_nsec / 1000 + local_c8.tv_sec * 1000000;
  }
  Abc_Print(iVar10,"%s =","Time");
  Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar5 - local_d8) / 1000000.0);
  uVar9 = 2;
  iVar2 = iVar3;
  do {
    iVar10 = Abc_ZddPermProduct(p,iVar2,iVar3);
    uVar11 = Abc_ZddCountPaths(p,iVar10);
    uVar12 = Abc_ZddCount_rec(p,iVar10);
    Abc_ZddUnmark_rec(p,iVar10);
    iVar7 = (int)uVar9;
    printf("Iter %2d -> %8d  Nodes = %7d  Used = %10d  ",uVar9,(ulong)uVar11,(ulong)uVar12,
           (ulong)(uint)p->nObjs);
    level = 3;
    iVar4 = clock_gettime(3,&local_c8);
    if (iVar4 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_c8.tv_nsec / 1000 + local_c8.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar5 - local_d8) / 1000000.0);
  } while ((iVar2 != iVar10) && (uVar9 = (ulong)(iVar7 + 1), iVar2 = iVar10, iVar7 != 100));
  Abc_ZddManFree(p);
  return;
}

Assistant:

void Abc_EnumerateCubeStatesZdd()
{
    int pXYZ[3][9][2] = {
        { {3, 5}, {3,17}, {3,15}, {1, 6}, {1,16}, {1,14}, {2, 4}, {2,18}, {2,13} },
        { {2,14}, {2,24}, {2,12}, {3,13}, {3,23}, {3,10}, {1,15}, {1,22}, {1,11} },
        { {1,10}, {1, 7}, {1, 4}, {3,12}, {3, 9}, {3, 6}, {2,11}, {2, 8}, {2, 5} }  };
#ifdef WIN32
    int LogObj = 24;
#else
    int LogObj = 27;
#endif
    Abc_ZddMan * p;
    int i, k, pComb[9], pPerm[24], nSize;
    int ZddTurn1, ZddTurn2, ZddTurn3, ZddTurns, ZddAll;
    abctime clk = Abc_Clock();
    printf( "Enumerating states of 2x2x2 cube.\n" );
    p = Abc_ZddManAlloc( 24 * 23 / 2, 1 << LogObj ); // finished with 2^27 (4 GB)
    Abc_ZddManCreatePerms( p, 24 );
    // init state
    printf( "Iter %2d -> %8d  Nodes = %7d  Used = %10d  ", 0, 1, 0, 2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // first 9 states
    ZddTurns = 1;
    for ( i = 0; i < 3; i++ )
    {
        for ( k = 0; k < 24; k++ )
            pPerm[k] = k;
        for ( k = 0; k < 9; k++ )
            ABC_SWAP( int, pPerm[pXYZ[i][k][0]-1], pPerm[pXYZ[i][k][1]-1] );
        nSize = Abc_ZddPerm2Comb( pPerm, 24, pComb );
        assert( nSize == 9 );
        for ( k = 0; k < 9; k++ )
            pComb[k] = Abc_ZddVarIJ( p, pComb[k] >> 16, pComb[k] & 0xffff );
        // add first turn
        ZddTurn1  = Abc_ZddBuildSet( p, pComb, 9 );
        ZddTurns = Abc_ZddUnion( p, ZddTurns, ZddTurn1 );
        //Abc_ZddPrint( p, ZddTurn1 );
        // add second turn
        ZddTurn2 = Abc_ZddPermProduct( p, ZddTurn1, ZddTurn1 );
        ZddTurns = Abc_ZddUnion( p, ZddTurns, ZddTurn2 );
        //Abc_ZddPrint( p, ZddTurn2 );
        // add third turn
        ZddTurn3 = Abc_ZddPermProduct( p, ZddTurn2, ZddTurn1 );
        ZddTurns = Abc_ZddUnion( p, ZddTurns, ZddTurn3 );
        //Abc_ZddPrint( p, ZddTurn3 );
        //printf( "\n" );
    }
    //Abc_ZddPrint( p, ZddTurns );
    printf( "Iter %2d -> %8d  Nodes = %7d  Used = %10d  ", 1, Abc_ZddCountPaths(p, ZddTurns), Abc_ZddCountNodes(p, ZddTurns), p->nObjs );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // other states
    ZddAll = ZddTurns;
    for ( i = 2; i <= 100; i++ )
    {
        int ZddAllPrev = ZddAll;
        ZddAll = Abc_ZddPermProduct( p, ZddAll, ZddTurns );
        printf( "Iter %2d -> %8d  Nodes = %7d  Used = %10d  ", i, Abc_ZddCountPaths(p, ZddAll), Abc_ZddCountNodes(p, ZddAll), p->nObjs );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        if ( ZddAllPrev == ZddAll )
            break;
    }
    Abc_ZddManFree( p );
}